

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall
cmFileCommand::HandleHashCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *this_00;
  size_type sVar1;
  const_reference pvVar2;
  ostream *poVar3;
  char *pcVar4;
  auto_ptr_ref<cmCryptoHash> r;
  cmCryptoHash *pcVar5;
  ulong uVar6;
  bool bVar7;
  string local_3c0;
  string local_3a0 [32];
  undefined1 local_380 [8];
  ostringstream e_1;
  undefined1 local_200 [8];
  string out;
  auto_ptr<cmCryptoHash> local_1d0;
  auto_ptr<cmCryptoHash> hash;
  ostringstream local_198 [8];
  ostringstream e;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmFileCommand *this_local;
  
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar1 != 3) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,0);
    poVar3 = std::operator<<((ostream *)local_198,(string *)pvVar2);
    std::operator<<(poVar3," requires a file name and output variable");
    std::__cxx11::ostringstream::str();
    cmCommand::SetError(&this->super_cmCommand,(string *)&hash);
    std::__cxx11::string::~string((string *)&hash);
    this_local._7_1_ = 0;
    std::__cxx11::ostringstream::~ostringstream(local_198);
    goto LAB_005c277d;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](args,0);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmCryptoHash::New((cmCryptoHash *)((long)&out.field_2 + 8),pcVar4);
  r = cmsys::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)(out.field_2._M_local_buf + 8));
  cmsys::auto_ptr<cmCryptoHash>::auto_ptr(&local_1d0,r);
  cmsys::auto_ptr<cmCryptoHash>::~auto_ptr((auto_ptr<cmCryptoHash> *)((long)&out.field_2 + 8));
  pcVar5 = cmsys::auto_ptr<cmCryptoHash>::get(&local_1d0);
  if (pcVar5 == (cmCryptoHash *)0x0) {
LAB_005c2753:
    this_local._7_1_ = 0;
  }
  else {
    pcVar5 = cmsys::auto_ptr<cmCryptoHash>::operator->(&local_1d0);
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,1);
    cmCryptoHash::HashFile((string *)local_200,pcVar5,pvVar2);
    uVar6 = std::__cxx11::string::empty();
    bVar7 = (uVar6 & 1) != 0;
    if (bVar7) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_380);
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,0);
      poVar3 = std::operator<<((ostream *)local_380,(string *)pvVar2);
      poVar3 = std::operator<<(poVar3," failed to read file \"");
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,1);
      poVar3 = std::operator<<(poVar3,(string *)pvVar2);
      poVar3 = std::operator<<(poVar3,"\": ");
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      std::operator<<(poVar3,local_3a0);
      std::__cxx11::string::~string(local_3a0);
      std::__cxx11::ostringstream::str();
      cmCommand::SetError(&this->super_cmCommand,&local_3c0);
      std::__cxx11::string::~string((string *)&local_3c0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_380);
    }
    else {
      this_00 = (this->super_cmCommand).Makefile;
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,2);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddDefinition(this_00,pvVar2,pcVar4);
      this_local._7_1_ = 1;
    }
    std::__cxx11::string::~string((string *)local_200);
    if (bVar7) goto LAB_005c2753;
  }
  cmsys::auto_ptr<cmCryptoHash>::~auto_ptr(&local_1d0);
LAB_005c277d:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmFileCommand::HandleHashCommand(std::vector<std::string> const& args)
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  if(args.size() != 3)
    {
    std::ostringstream e;
    e << args[0] << " requires a file name and output variable";
    this->SetError(e.str());
    return false;
    }

  cmsys::auto_ptr<cmCryptoHash> hash(cmCryptoHash::New(args[0].c_str()));
  if(hash.get())
    {
    std::string out = hash->HashFile(args[1]);
    if(!out.empty())
      {
      this->Makefile->AddDefinition(args[2], out.c_str());
      return true;
      }
    std::ostringstream e;
    e << args[0] << " failed to read file \"" << args[1] << "\": "
      << cmSystemTools::GetLastSystemError();
    this->SetError(e.str());
    }
  return false;
#else
  std::ostringstream e;
  e << args[0] << " not available during bootstrap";
  this->SetError(e.str().c_str());
  return false;
#endif
}